

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
* __thiscall
google::
sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::operator=(sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            *this,sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *ht)

{
  int iVar1;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_RSI;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  size_type in_stack_000000b0;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_000000b8;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_000000c0;
  
  if (in_RSI != in_RDI) {
    memcpy(in_RDI,in_RSI,0x30);
    iVar1 = (in_RSI->key_info).super_Hasher.num_hashes_;
    (in_RDI->key_info).super_Hasher.id_ = (in_RSI->key_info).super_Hasher.id_;
    (in_RDI->key_info).super_Hasher.num_hashes_ = iVar1;
    *(undefined8 *)&(in_RDI->key_info).super_Hasher.num_compares_ =
         *(undefined8 *)&(in_RSI->key_info).super_Hasher.num_compares_;
    (in_RDI->key_info).delkey = (in_RSI->key_info).delkey;
    in_RDI->num_deleted = in_RSI->num_deleted;
    copy_from(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  }
  return in_RDI;
}

Assistant:

sparse_hashtable& operator=(const sparse_hashtable& ht) {
    if (&ht == this) return *this;  // don't copy onto ourselves
    settings = ht.settings;
    key_info = ht.key_info;
    num_deleted = ht.num_deleted;
    // copy_from() calls clear and sets num_deleted to 0 too
    copy_from(ht, HT_MIN_BUCKETS);
    // we purposefully don't copy the allocator, which may not be copyable
    return *this;
  }